

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offsetPtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  BYTE *pBVar1;
  uint uVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  ZSTD_matchState_t *pZVar6;
  U32 UVar7;
  U32 UVar8;
  int iVar9;
  U32 UVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  uint *puVar14;
  uint *puVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  byte *pInLimit;
  uint uVar20;
  uint uVar21;
  BYTE *pBVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  byte *pbVar30;
  int iVar31;
  ulong uVar32;
  int iVar33;
  ulong uVar34;
  BYTE *pBVar35;
  int iVar36;
  uint local_110;
  uint *local_108;
  ulong local_100;
  size_t local_f8;
  uint *local_f0;
  U32 dummy32;
  uint local_3c;
  uint *local_38;
  
  pUVar3 = ms->hashTable;
  sVar11 = ZSTD_hashPtr(ip,(ms->cParams).hashLog,mls);
  pBVar4 = (ms->window).base;
  uVar25 = (int)ip - (int)pBVar4;
  uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  UVar7 = (ms->window).lowLimit;
  UVar10 = uVar25 - uVar17;
  if (uVar25 - UVar7 <= uVar17) {
    UVar10 = UVar7;
  }
  if (ms->loadedDictEnd != 0) {
    UVar10 = UVar7;
  }
  uVar18 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar17 = uVar25 - uVar18;
  if (uVar25 < uVar18) {
    uVar17 = 0;
  }
  uVar28 = UVar10;
  if (UVar10 < uVar17) {
    uVar28 = uVar17;
  }
  uVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  if (iend + -8 < ip) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3fdb,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_38 = pUVar3 + sVar11;
  pUVar3 = ms->chainTable;
  puVar15 = local_38;
  uVar23 = uVar24;
  uVar29 = 0;
  while (uVar2 = *puVar15, uVar28 < uVar2) {
    puVar15 = pUVar3 + (uVar2 & uVar18) * 2;
    if ((puVar15[1] != 1) || (uVar23 < 2)) {
      if (puVar15[1] == 1) {
        puVar15[0] = 0;
        puVar15[1] = 0;
      }
      break;
    }
    puVar15[1] = uVar29;
    uVar23 = uVar23 - 1;
    uVar29 = uVar2;
  }
  do {
    if (uVar29 == 0) break;
    pBVar5 = (ms->window).dictBase;
    uVar2 = (ms->window).dictLimit;
    uVar27 = (ulong)uVar2;
    pInLimit = iend;
    pBVar22 = pBVar4;
    if (uVar29 < uVar2) {
      pInLimit = pBVar5 + uVar27;
      pBVar22 = pBVar5;
    }
    uVar21 = (ms->window).lowLimit;
    uVar19 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar20 = uVar29 - uVar19;
    if (uVar29 - uVar21 <= uVar19) {
      uVar20 = uVar21;
    }
    if (uVar29 < uVar28) {
      __assert_fail("current >= btLow",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3f34,
                    "void ZSTD_insertDUBT1(ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                   );
    }
    pbVar30 = pBVar22 + uVar29;
    if (pInLimit <= pbVar30) {
      __assert_fail("ip < iend",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3f35,
                    "void ZSTD_insertDUBT1(ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                   );
    }
    UVar7 = pUVar3[(ulong)((uVar29 & uVar18) * 2) + 1];
    uVar26 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    local_108 = pUVar3 + (uVar29 & uVar26) * 2;
    uVar21 = *local_108;
    uVar19 = 0;
    uVar13 = 0;
    uVar16 = 0;
    puVar15 = local_108 + 1;
LAB_001573b5:
    if ((uVar23 == uVar19) || (uVar21 <= uVar20)) goto LAB_00157556;
    uVar12 = uVar13;
    if (uVar16 < uVar13) {
      uVar12 = uVar16;
    }
    if (uVar29 <= uVar21) {
      __assert_fail("matchIndex < current",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3f3a,
                    "void ZSTD_insertDUBT1(ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                   );
    }
    uVar34 = (ulong)uVar21;
    uVar32 = uVar12 + uVar34;
    pBVar22 = pBVar4;
    if (dictMode == ZSTD_extDict) {
      if ((uVar29 < uVar2) || (uVar27 <= uVar32)) {
        if (uVar32 < uVar27) {
          pBVar22 = pBVar5;
        }
        goto LAB_0015746e;
      }
      sVar11 = ZSTD_count_2segments
                         (pbVar30 + uVar12,pBVar5 + uVar34 + uVar12,pInLimit,pBVar5 + uVar27,
                          pBVar4 + uVar27);
      uVar12 = sVar11 + uVar12;
      pBVar22 = pBVar4 + uVar34;
      if (uVar12 + uVar34 < uVar27) {
        pBVar22 = pBVar5 + uVar34;
      }
    }
    else {
LAB_0015746e:
      if ((uVar2 <= uVar29) && (uVar32 < uVar27)) {
        __assert_fail("(matchIndex+matchLength >= dictLimit) || (current < dictLimit)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3f46,
                      "void ZSTD_insertDUBT1(ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                     );
      }
      sVar11 = ZSTD_count(pbVar30 + uVar12,pBVar22 + uVar34 + uVar12,pInLimit);
      uVar12 = sVar11 + uVar12;
      pBVar22 = pBVar22 + uVar34;
    }
    if (pbVar30 + uVar12 == pInLimit) goto LAB_00157556;
    puVar14 = pUVar3 + (uVar21 & uVar26) * 2;
    if (pbVar30[uVar12] <= pBVar22[uVar12]) {
      *puVar15 = uVar21;
      uVar13 = uVar12;
      puVar15 = puVar14;
      if (uVar21 <= uVar28) {
        puVar15 = &local_3c;
        goto LAB_00157556;
      }
LAB_0015751e:
      uVar21 = *puVar15;
      uVar19 = uVar19 + 1;
      puVar15 = puVar14;
      goto LAB_001573b5;
    }
    *local_108 = uVar21;
    if (uVar28 < uVar21) {
      local_108 = puVar14 + 1;
      puVar14 = puVar15;
      puVar15 = local_108;
      uVar16 = uVar12;
      goto LAB_0015751e;
    }
    local_108 = &local_3c;
LAB_00157556:
    *puVar15 = 0;
    *local_108 = 0;
    uVar23 = uVar23 + 1;
    uVar29 = UVar7;
  } while( true );
  pBVar5 = (ms->window).dictBase;
  uVar16 = (ulong)(ms->window).dictLimit;
  uVar13 = (ulong)((uVar18 & uVar25) * 2);
  local_f0 = pUVar3 + uVar13;
  local_110 = uVar25 + 9;
  uVar28 = *local_38;
  *local_38 = uVar25;
  iVar33 = -uVar24;
  uVar27 = 0;
  local_f8 = 0;
  puVar15 = pUVar3 + uVar13 + 1;
  uVar13 = 0;
  do {
    iVar33 = iVar33 + 1;
    uVar12 = (ulong)uVar28;
    if ((iVar33 == 1) || (uVar28 <= UVar10)) goto LAB_001577f2;
    uVar32 = uVar13;
    if (uVar27 < uVar13) {
      uVar32 = uVar27;
    }
    if ((dictMode == ZSTD_extDict) && (uVar32 + uVar12 < uVar16)) {
      pBVar1 = pBVar5 + uVar12;
      sVar11 = ZSTD_count_2segments
                         (ip + uVar32,pBVar1 + uVar32,iend,pBVar5 + uVar16,pBVar4 + uVar16);
      uVar32 = sVar11 + uVar32;
      pBVar22 = pBVar4 + uVar12;
      if (uVar32 + uVar12 < uVar16) {
        pBVar22 = pBVar1;
      }
    }
    else {
      sVar11 = ZSTD_count(ip + uVar32,pBVar4 + uVar12 + uVar32,iend);
      uVar32 = sVar11 + uVar32;
      pBVar22 = pBVar4 + uVar12;
    }
    if (local_f8 < uVar32) {
      if (local_110 - uVar28 < uVar32) {
        local_110 = uVar28 + (int)uVar32;
      }
      UVar7 = ZSTD_highbit32((uVar25 + 1) - uVar28);
      UVar8 = ZSTD_highbit32((int)*offsetPtr + 1);
      if ((int)(UVar7 - UVar8) < ((int)uVar32 - (int)local_f8) * 4) {
        *offsetPtr = (ulong)((uVar25 + 2) - uVar28);
        local_f8 = uVar32;
      }
      if (ip + uVar32 == iend) {
        iVar33 = -iVar33;
        if (dictMode == ZSTD_dictMatchState) {
          iVar33 = 0;
        }
        goto LAB_001577fd;
      }
    }
    puVar14 = pUVar3 + (uVar28 & uVar18) * 2;
    if (pBVar22[uVar32] < ip[uVar32]) {
      *local_f0 = uVar28;
      if (uVar28 <= uVar17) {
        local_f0 = &dummy32;
LAB_001577f2:
        iVar33 = -iVar33;
LAB_001577fd:
        *puVar15 = 0;
        *local_f0 = 0;
        if ((dictMode == ZSTD_dictMatchState) && (iVar33 != 0)) {
          pZVar6 = ms->dictMatchState;
          pUVar3 = pZVar6->hashTable;
          sVar11 = ZSTD_hashPtr(ip,(pZVar6->cParams).hashLog,mls);
          puVar15 = pUVar3 + sVar11;
          pBVar4 = (ms->window).base;
          uVar17 = (ms->window).dictLimit;
          iVar31 = (int)ip - (int)pBVar4;
          pBVar5 = (pZVar6->window).nextSrc;
          pBVar22 = (pZVar6->window).base;
          uVar27 = (long)pBVar5 - (long)pBVar22;
          uVar18 = (pZVar6->window).lowLimit;
          iVar9 = (int)uVar27;
          uVar23 = (ms->window).lowLimit - iVar9;
          pUVar3 = pZVar6->chainTable;
          uVar24 = ~(-1 << ((char)(pZVar6->cParams).chainLog - 1U & 0x1f));
          uVar28 = iVar9 - uVar24;
          if (iVar9 - uVar18 <= uVar24) {
            uVar28 = uVar18;
          }
          local_100 = 0;
          uVar13 = 0;
          while( true ) {
            iVar33 = -iVar33;
            while( true ) {
              iVar33 = iVar33 + 1;
              if (iVar33 == 1) goto LAB_00157a46;
              uVar29 = *puVar15;
              uVar16 = (ulong)uVar29;
              if (uVar29 <= uVar18) goto LAB_00157a46;
              uVar12 = uVar13;
              if (local_100 < uVar13) {
                uVar12 = local_100;
              }
              pBVar1 = pBVar22 + uVar16;
              sVar11 = ZSTD_count_2segments(ip + uVar12,pBVar1 + uVar12,iend,pBVar5,pBVar4 + uVar17)
              ;
              uVar12 = sVar11 + uVar12;
              pBVar35 = pBVar4 + uVar16 + uVar23;
              if (uVar12 + uVar16 < (uVar27 & 0xffffffff)) {
                pBVar35 = pBVar1;
              }
              if (local_f8 < uVar12) {
                iVar9 = uVar23 + uVar29;
                iVar36 = (int)uVar12 - (int)local_f8;
                UVar7 = ZSTD_highbit32((iVar31 + 1) - iVar9);
                UVar10 = ZSTD_highbit32((int)*offsetPtr + 1);
                if ((int)(UVar7 - UVar10) < iVar36 * 4) {
                  *offsetPtr = (ulong)(uint)((iVar31 + 2) - iVar9);
                  local_f8 = uVar12;
                }
                if (ip + uVar12 == iend) goto LAB_00157a46;
              }
              puVar15 = pUVar3 + (uVar29 & uVar24) * 2;
              if (pBVar35[uVar12] < ip[uVar12]) break;
              uVar13 = uVar12;
              if (uVar29 <= uVar28) goto LAB_00157a46;
            }
            if (uVar29 <= uVar28) break;
            iVar33 = -iVar33;
            puVar15 = puVar15 + 1;
            local_100 = uVar12;
          }
        }
LAB_00157a46:
        if (uVar25 + 8 < local_110) {
          ms->nextToUpdate = local_110 - 8;
          return local_f8;
        }
        __assert_fail("matchEndIdx > current+8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4045,
                      "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                     );
      }
      local_f0 = puVar14 + 1;
      puVar14 = puVar15;
      puVar15 = local_f0;
      uVar27 = uVar32;
      uVar32 = uVar13;
    }
    else {
      *puVar15 = uVar28;
      puVar15 = puVar14;
      if (uVar28 <= uVar17) {
        puVar15 = &dummy32;
        goto LAB_001577f2;
      }
    }
    uVar28 = *puVar15;
    puVar15 = puVar14;
    uVar13 = uVar32;
  } while( true );
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offsetPtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const current = (U32)(ip-base);
    U32    const windowLow = ZSTD_getLowestMatchIndex(ms, current, cParams->windowLog);

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= current) ? 0 : current - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", current);
    assert(ip <= iend-8);   /* required for h calculation */

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(current&btMask);
        U32* largerPtr  = bt + 2*(current&btMask) + 1;
        U32 matchEndIdx = current + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = current;   /* Update Hash Table */

        while (nbCompares-- && (matchIndex > windowLow)) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(current-matchIndex+1) - ZSTD_highbit32((U32)offsetPtr[0]+1)) )
                    bestLength = matchLength, *offsetPtr = ZSTD_REP_MOVE + current - matchIndex;
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offsetPtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > current+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = current - ((U32)*offsetPtr - ZSTD_REP_MOVE); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        current, (U32)bestLength, (U32)*offsetPtr, mIndex);
        }
        return bestLength;
    }
}